

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# txrequest.cpp
# Opt level: O0

void __thiscall TxRequestTracker::Impl::PostGetRequestableSanityCheck(Impl *this,microseconds now)

{
  long lVar1;
  bool bVar2;
  ordered_index_impl<(anonymous_namespace)::ByPeerViewExtractor,_std::less<std::tuple<long,_bool,_const_uint256_&>_>,_boost::multi_index::detail::nth_layer<1,_(anonymous_namespace)::Announcement,_(anonymous_namespace)::Announcement_Indices,_std::allocator<(anonymous_namespace)::Announcement>_>,_boost::mpl::v_item<(anonymous_namespace)::ByPeer,_boost::mpl::vector0<mpl_::na>,_0>,_boost::multi_index::detail::ordered_unique_tag,_boost::multi_index::detail::null_augment_policy>
  *in_RDI;
  long in_FS_OFFSET;
  Announcement *ann;
  Index *__range1;
  const_iterator __end1;
  const_iterator __begin1;
  undefined6 in_stack_ffffffffffffffb8;
  strong_ordering in_stack_ffffffffffffffbe;
  strong_ordering in_stack_ffffffffffffffbf;
  value_type *in_stack_ffffffffffffffc0;
  Announcement *this_00;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  this_00 = (Announcement *)(in_RDI + 1);
  boost::multi_index::detail::
  ordered_index_impl<(anonymous_namespace)::ByPeerViewExtractor,_std::less<std::tuple<long,_bool,_const_uint256_&>_>,_boost::multi_index::detail::nth_layer<1,_(anonymous_namespace)::Announcement,_(anonymous_namespace)::Announcement_Indices,_std::allocator<(anonymous_namespace)::Announcement>_>,_boost::mpl::v_item<(anonymous_namespace)::ByPeer,_boost::mpl::vector0<mpl_::na>,_0>,_boost::multi_index::detail::ordered_unique_tag,_boost::multi_index::detail::null_augment_policy>
  ::begin(in_RDI);
  boost::multi_index::detail::
  ordered_index_impl<(anonymous_namespace)::ByPeerViewExtractor,_std::less<std::tuple<long,_bool,_const_uint256_&>_>,_boost::multi_index::detail::nth_layer<1,_(anonymous_namespace)::Announcement,_(anonymous_namespace)::Announcement_Indices,_std::allocator<(anonymous_namespace)::Announcement>_>,_boost::mpl::v_item<(anonymous_namespace)::ByPeer,_boost::mpl::vector0<mpl_::na>,_0>,_boost::multi_index::detail::ordered_unique_tag,_boost::multi_index::detail::null_augment_policy>
  ::end(in_RDI);
  do {
    bVar2 = boost::operators_impl::operator!=
                      ((bidir_node_iterator<boost::multi_index::detail::ordered_index_node<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::ordered_index_node<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::ordered_index_node<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::index_node_base<(anonymous_namespace)::Announcement,_std::allocator<(anonymous_namespace)::Announcement>_>_>_>_>_>
                        *)this_00,
                       (bidir_node_iterator<boost::multi_index::detail::ordered_index_node<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::ordered_index_node<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::ordered_index_node<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::index_node_base<(anonymous_namespace)::Announcement,_std::allocator<(anonymous_namespace)::Announcement>_>_>_>_>_>
                        *)in_stack_ffffffffffffffc0);
    if (!bVar2) {
      if (*(long *)(in_FS_OFFSET + 0x28) != lVar1) {
        __stack_chk_fail();
      }
      return;
    }
    in_stack_ffffffffffffffc0 =
         boost::multi_index::detail::
         bidir_node_iterator<boost::multi_index::detail::ordered_index_node<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::ordered_index_node<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::ordered_index_node<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::index_node_base<(anonymous_namespace)::Announcement,_std::allocator<(anonymous_namespace)::Announcement>_>_>_>_>_>
         ::operator*((bidir_node_iterator<boost::multi_index::detail::ordered_index_node<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::ordered_index_node<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::ordered_index_node<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::index_node_base<(anonymous_namespace)::Announcement,_std::allocator<(anonymous_namespace)::Announcement>_>_>_>_>_>
                      *)CONCAT17(in_stack_ffffffffffffffbf._M_value,
                                 CONCAT16(in_stack_ffffffffffffffbe._M_value,
                                          in_stack_ffffffffffffffb8)));
    bVar2 = anon_unknown.dwarf_237ecec::Announcement::IsWaiting(this_00);
    if (bVar2) {
      in_stack_ffffffffffffffbf =
           _GLOBAL__N_1::std::chrono::
           operator<=><long,_std::ratio<1L,_1000000L>,_long,_std::ratio<1L,_1000000L>_>
                     ((duration<long,_std::ratio<1L,_1000000L>_> *)in_RDI,
                      (duration<long,_std::ratio<1L,_1000000L>_> *)this_00);
      std::__cmp_cat::__unspec::__unspec
                ((__unspec *)
                 CONCAT17(in_stack_ffffffffffffffbf._M_value,
                          CONCAT16(in_stack_ffffffffffffffbe._M_value,in_stack_ffffffffffffffb8)),
                 (__unspec *)0x1481510);
      bVar2 = std::operator>(in_stack_ffffffffffffffbf._M_value);
      if (!bVar2) {
        __assert_fail("ann.m_time > now",
                      "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/txrequest.cpp"
                      ,0x16d,
                      "void TxRequestTracker::Impl::PostGetRequestableSanityCheck(std::chrono::microseconds) const"
                     );
      }
    }
    else {
      bVar2 = anon_unknown.dwarf_237ecec::Announcement::IsSelectable(this_00);
      if (bVar2) {
        in_stack_ffffffffffffffbe =
             _GLOBAL__N_1::std::chrono::
             operator<=><long,_std::ratio<1L,_1000000L>,_long,_std::ratio<1L,_1000000L>_>
                       ((duration<long,_std::ratio<1L,_1000000L>_> *)in_RDI,
                        (duration<long,_std::ratio<1L,_1000000L>_> *)this_00);
        std::__cmp_cat::__unspec::__unspec
                  ((__unspec *)
                   CONCAT17(in_stack_ffffffffffffffbf._M_value,
                            CONCAT16(in_stack_ffffffffffffffbe._M_value,in_stack_ffffffffffffffb8)),
                   (__unspec *)0x1481578);
        bVar2 = std::operator<=(in_stack_ffffffffffffffbe._M_value);
        if (!bVar2) {
          __assert_fail("ann.m_time <= now",
                        "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/txrequest.cpp"
                        ,0x171,
                        "void TxRequestTracker::Impl::PostGetRequestableSanityCheck(std::chrono::microseconds) const"
                       );
        }
      }
    }
    boost::multi_index::detail::
    bidir_node_iterator<boost::multi_index::detail::ordered_index_node<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::ordered_index_node<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::ordered_index_node<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::index_node_base<(anonymous_namespace)::Announcement,_std::allocator<(anonymous_namespace)::Announcement>_>_>_>_>_>
    ::operator++((bidir_node_iterator<boost::multi_index::detail::ordered_index_node<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::ordered_index_node<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::ordered_index_node<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::index_node_base<(anonymous_namespace)::Announcement,_std::allocator<(anonymous_namespace)::Announcement>_>_>_>_>_>
                  *)CONCAT17(in_stack_ffffffffffffffbf._M_value,
                             CONCAT16(in_stack_ffffffffffffffbe._M_value,in_stack_ffffffffffffffb8))
                );
  } while( true );
}

Assistant:

void PostGetRequestableSanityCheck(std::chrono::microseconds now) const
    {
        for (const Announcement& ann : m_index) {
            if (ann.IsWaiting()) {
                // REQUESTED and CANDIDATE_DELAYED must have a time in the future (they should have been converted
                // to COMPLETED/CANDIDATE_READY respectively).
                assert(ann.m_time > now);
            } else if (ann.IsSelectable()) {
                // CANDIDATE_READY and CANDIDATE_BEST cannot have a time in the future (they should have remained
                // CANDIDATE_DELAYED, or should have been converted back to it if time went backwards).
                assert(ann.m_time <= now);
            }
        }
    }